

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O3

void Timer::SetMaxDelta(int max_delta)

{
  unique_ptr<Clock,_std::default_delete<Clock>_> uVar1;
  __uniq_ptr_data<Clock,_std::default_delete<Clock>,_true,_true> this;
  bool bVar2;
  
  uVar1._M_t.super___uniq_ptr_impl<Clock,_std::default_delete<Clock>_>._M_t.
  super__Tuple_impl<0UL,_Clock_*,_std::default_delete<Clock>_>.super__Head_base<0UL,_Clock_*,_false>
  ._M_head_impl =
       clock._M_t.super___uniq_ptr_impl<Clock,_std::default_delete<Clock>_>._M_t.
       super__Tuple_impl<0UL,_Clock_*,_std::default_delete<Clock>_>.
       super__Head_base<0UL,_Clock_*,_false>._M_head_impl;
  if ((__uniq_ptr_impl<Clock,_std::default_delete<Clock>_>)
      clock._M_t.super___uniq_ptr_impl<Clock,_std::default_delete<Clock>_>._M_t.
      super__Tuple_impl<0UL,_Clock_*,_std::default_delete<Clock>_>.
      super__Head_base<0UL,_Clock_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<Clock,_std::default_delete<Clock>_>)0x0) {
    this.super___uniq_ptr_impl<Clock,_std::default_delete<Clock>_>._M_t.
    super__Tuple_impl<0UL,_Clock_*,_std::default_delete<Clock>_>.
    super__Head_base<0UL,_Clock_*,_false>._M_head_impl =
         (__uniq_ptr_impl<Clock,_std::default_delete<Clock>_>)operator_new(0x10);
    Clock::Clock((Clock *)this.super___uniq_ptr_impl<Clock,_std::default_delete<Clock>_>._M_t.
                          super__Tuple_impl<0UL,_Clock_*,_std::default_delete<Clock>_>.
                          super__Head_base<0UL,_Clock_*,_false>._M_head_impl,max_delta);
    uVar1 = clock;
    bVar2 = (__uniq_ptr_impl<Clock,_std::default_delete<Clock>_>)
            clock._M_t.super___uniq_ptr_impl<Clock,_std::default_delete<Clock>_>._M_t.
            super__Tuple_impl<0UL,_Clock_*,_std::default_delete<Clock>_>.
            super__Head_base<0UL,_Clock_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<Clock,_std::default_delete<Clock>_>)0x0;
    clock._M_t.super___uniq_ptr_impl<Clock,_std::default_delete<Clock>_>._M_t.
    super__Tuple_impl<0UL,_Clock_*,_std::default_delete<Clock>_>.
    super__Head_base<0UL,_Clock_*,_false>._M_head_impl =
         (__uniq_ptr_data<Clock,_std::default_delete<Clock>,_true,_true>)
         (__uniq_ptr_data<Clock,_std::default_delete<Clock>,_true,_true>)
         this.super___uniq_ptr_impl<Clock,_std::default_delete<Clock>_>._M_t.
         super__Tuple_impl<0UL,_Clock_*,_std::default_delete<Clock>_>.
         super__Head_base<0UL,_Clock_*,_false>._M_head_impl;
    if (bVar2) {
      operator_delete((void *)uVar1._M_t.super___uniq_ptr_impl<Clock,_std::default_delete<Clock>_>.
                              _M_t.super__Tuple_impl<0UL,_Clock_*,_std::default_delete<Clock>_>.
                              super__Head_base<0UL,_Clock_*,_false>._M_head_impl,0x10);
      return;
    }
  }
  else {
    if (max_delta < 1) {
      Console::Wrn("Invalid clock max delta. Defaulting to 1000 ms.");
      max_delta = 1000;
    }
    *(int *)((long)uVar1._M_t.super___uniq_ptr_impl<Clock,_std::default_delete<Clock>_>._M_t.
                   super__Tuple_impl<0UL,_Clock_*,_std::default_delete<Clock>_>.
                   super__Head_base<0UL,_Clock_*,_false>._M_head_impl + 0xc) = max_delta;
  }
  return;
}

Assistant:

void Timer::SetMaxDelta(int max_delta)
{
	if (!clock)
		clock.reset(new Clock(max_delta));
	else
		clock->SetMaxDelta(max_delta);
}